

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_charset.hpp
# Opt level: O3

void __thiscall
boost::xpressive::detail::char_overflow_handler::operator()
          (char_overflow_handler *this,range_check_result result)

{
  undefined **local_60 [2];
  undefined **local_50;
  refcount_ptr<boost::exception_detail::error_info_container> local_48;
  char *pcStack_40;
  char *local_38;
  undefined8 local_30;
  error_type local_28;
  source_location local_20;
  
  if (result == cInRange) {
    return;
  }
  std::runtime_error::runtime_error
            ((runtime_error *)local_60,"character escape too large to fit in target character type")
  ;
  local_48.px_ = (error_info_container *)0x0;
  pcStack_40 = (char *)0x0;
  local_38 = (char *)0x0;
  local_30._0_4_ = -1;
  local_30._4_4_ = -1;
  local_60[0] = &PTR__regex_error_00193398;
  local_50 = &PTR__regex_error_001933c0;
  local_28 = error_escape;
  local_20.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O3/KWStyle/Utilities/boost/xpressive/detail/dynamic/parse_charset.hpp"
  ;
  local_20.function_ =
       "void boost::xpressive::detail::char_overflow_handler::operator()(numeric::range_check_result) const"
  ;
  local_20.line_ = 0x3f;
  local_20.column_ = 0;
  throw_exception<boost::xpressive::regex_error>((regex_error *)local_60,&local_20);
}

Assistant:

void operator ()(numeric::range_check_result result) const // throw(regex_error)
    {
        if(numeric::cInRange != result)
        {
            BOOST_THROW_EXCEPTION(
                regex_error(
                    regex_constants::error_escape
                  , "character escape too large to fit in target character type"
                )
            );
        }
    }